

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollfd.c
# Opt level: O2

int lws_callback_on_writable_all_protocol(lws_context *context,lws_protocols *protocol)

{
  uint uVar1;
  lws_vhost *vhost;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  lws_vhost **pplVar5;
  long lVar6;
  
  if (context != (lws_context *)0x0) {
    pplVar5 = &context->vhost_list;
    while (vhost = *pplVar5, vhost != (lws_vhost *)0x0) {
      uVar1 = vhost->count_protocols;
      uVar3 = 0;
      if (0 < (int)uVar1) {
        uVar3 = (ulong)uVar1;
      }
      lVar6 = 8;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        if ((protocol->callback ==
             *(lws_callback_function **)((long)&vhost->protocols->name + lVar6)) &&
           (iVar2 = strcmp(protocol->name,*(char **)((long)vhost->protocols + lVar6 + -8)),
           iVar2 == 0)) {
          uVar3 = uVar4 & 0xffffffff;
          break;
        }
        lVar6 = lVar6 + 0x38;
      }
      if ((uint)uVar3 != uVar1) {
        lws_callback_on_writable_all_protocol_vhost(vhost,vhost->protocols + uVar3);
      }
      pplVar5 = &vhost->vhost_next;
    }
  }
  return 0;
}

Assistant:

int
lws_callback_on_writable_all_protocol(const struct lws_context *context,
				      const struct lws_protocols *protocol)
{
	struct lws_vhost *vhost;
	int n;

	if (!context)
		return 0;

	vhost = context->vhost_list;

	while (vhost) {
		for (n = 0; n < vhost->count_protocols; n++)
			if (protocol->callback ==
			     vhost->protocols[n].callback &&
			    !strcmp(protocol->name, vhost->protocols[n].name))
				break;
		if (n != vhost->count_protocols)
			lws_callback_on_writable_all_protocol_vhost(
				vhost, &vhost->protocols[n]);

		vhost = vhost->vhost_next;
	}

	return 0;
}